

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackendOpCodeAttrAsmJs.cpp
# Opt level: O3

int OpCodeAttrAsmJs::GetOpCodeAttributes(OpCodeAsmJs op)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined1 *puVar4;
  undefined6 in_register_0000003a;
  uint uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)op;
  if ((uint)CONCAT62(in_register_0000003a,op) < 0x100) {
    if (0xf7 < op) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackendOpCodeAttrAsmJs.cpp"
                         ,0x27,"(opIndex < (sizeof(*__countof_helper(OpcodeAttributesAsmJs)) + 0))",
                         "opIndex < (sizeof(*__countof_helper(OpcodeAttributesAsmJs)) + 0)");
      if (!bVar2) {
LAB_003d081b:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    puVar4 = OpcodeAttributesAsmJs;
  }
  else {
    uVar5 = op - 0x100;
    uVar6 = (ulong)uVar5;
    if (0x171 < uVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackendOpCodeAttrAsmJs.cpp"
                         ,0x2b,
                         "(opIndex < (sizeof(*__countof_helper(ExtendedOpcodeAttributesAsmJs)) + 0))"
                         ,"opIndex < (sizeof(*__countof_helper(ExtendedOpcodeAttributesAsmJs)) + 0)"
                        );
      if (!bVar2) goto LAB_003d081b;
      *puVar3 = 0;
    }
    puVar4 = ExtendedOpcodeAttributesAsmJs;
  }
  return *(int *)(puVar4 + uVar6 * 4);
}

Assistant:

static const int GetOpCodeAttributes( Js::OpCodeAsmJs op )
    {
        uint opIndex = (uint)op;
        if (opIndex <= (uint)Js::OpCodeAsmJs::MaxByteSizedOpcodes)
        {
            AnalysisAssert(opIndex < _countof(OpcodeAttributesAsmJs));
            return OpcodeAttributesAsmJs[opIndex];
        }
        opIndex -= ( Js::OpCodeAsmJs::MaxByteSizedOpcodes + 1 );
        AnalysisAssert(opIndex < _countof(ExtendedOpcodeAttributesAsmJs));
        return ExtendedOpcodeAttributesAsmJs[opIndex];
    }